

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.hpp
# Opt level: O1

void __thiscall Container::clear(Container *this)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer this_00;
  
  pIVar1 = (this->content).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar2 = (this->content).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pIVar1;
  if (pIVar2 != pIVar1) {
    do {
      Item::~Item(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pIVar2);
    (this->content).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_finish = pIVar1;
  }
  this->length = 0;
  return;
}

Assistant:

virtual void clear() {
	  this->content.clear();
	  length = 0;
  }